

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_868a::BuildSystemCAPI_CustomToolWithDiscoveredDependencies_Test::TestBody
          (BuildSystemCAPI_CustomToolWithDiscoveredDependencies_Test *this)

{
  bool bVar1;
  ostream *poVar2;
  llb_buildsystem_t *system_p;
  long lVar3;
  size_type sVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  char *pcVar7;
  byte bVar8;
  llb_buildsystem_delegate_t in_stack_fffffffffffff9b8;
  AssertHelper local_530;
  AssertionResult gtest_ar_1;
  string outputContentsSecondBuild;
  llb_data_t key;
  AssertHelper local_4b8;
  string outputFilePath;
  string indirectInputFilePath;
  string tmpDirPath;
  string outputContentsFirstBuild;
  string buildFilePath;
  string depInfoFilePath;
  string directInputFilePath;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  ostringstream buildFileContents;
  undefined8 local_118;
  undefined8 uStack_110;
  code *local_108;
  undefined8 local_100;
  code *local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  code *local_e0;
  code *local_d8;
  code *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  code *local_b0;
  code *local_a8;
  code *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  code *local_68;
  code *local_60;
  code *local_58;
  code *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  bVar8 = 0;
  llbuild::basic::sys::makeTmpDir_abi_cxx11_();
  for (sVar4 = 0; tmpDirPath._M_string_length != sVar4; sVar4 = sVar4 + 1) {
    if (tmpDirPath._M_dataplus._M_p[sVar4] == '\\') {
      tmpDirPath._M_dataplus._M_p[sVar4] = '/';
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &buildFileContents,&tmpDirPath,"/");
  std::operator+(&indirectInputFilePath,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &buildFileContents,"indirect-input-file");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_2b0,(string *)&indirectInputFilePath);
  std::__cxx11::string::string((string *)&local_2d0,"1",(allocator *)&buildFileContents);
  writeFileContents(&local_2b0,&local_2d0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &buildFileContents,&tmpDirPath,"/");
  std::operator+(&directInputFilePath,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &buildFileContents,"direct-input-file");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_2f0,(string *)&directInputFilePath);
  std::__cxx11::string::string((string *)&local_310,(string *)&indirectInputFilePath);
  writeFileContents(&local_2f0,&local_310);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &buildFileContents,&tmpDirPath,"/");
  std::operator+(&outputFilePath,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &buildFileContents,"output-file");
  std::__cxx11::string::_M_dispose();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &buildFileContents,&tmpDirPath,"/");
  std::operator+(&depInfoFilePath,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &buildFileContents,"dep-info-file");
  std::__cxx11::string::_M_dispose();
  std::operator+(&buildFilePath,&tmpDirPath,"/llbuild");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buildFileContents);
  poVar2 = std::operator<<((ostream *)&buildFileContents,"client:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&buildFileContents,"  name: basic");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>((ostream *)&buildFileContents);
  poVar2 = std::operator<<((ostream *)&buildFileContents,"targets:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&buildFileContents,"  \"\": [\"<all>\"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>((ostream *)&buildFileContents);
  poVar2 = std::operator<<((ostream *)&buildFileContents,"nodes:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&buildFileContents,"  \"");
  poVar2 = std::operator<<(poVar2,(string *)&outputFilePath);
  poVar2 = std::operator<<(poVar2,"\": {}");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>((ostream *)&buildFileContents);
  poVar2 = std::operator<<((ostream *)&buildFileContents,"commands:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&buildFileContents,"  \"copy-indirectly|");
  poVar2 = std::operator<<(poVar2,(string *)&directInputFilePath);
  poVar2 = std::operator<<(poVar2,"|");
  poVar2 = std::operator<<(poVar2,(string *)&outputFilePath);
  poVar2 = std::operator<<(poVar2,"|");
  poVar2 = std::operator<<(poVar2,(string *)&depInfoFilePath);
  poVar2 = std::operator<<(poVar2,"\":");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&buildFileContents,"    tool: custom-depinfo-tester-tool");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&buildFileContents,"    inputs: [\"");
  poVar2 = std::operator<<(poVar2,(string *)&directInputFilePath);
  poVar2 = std::operator<<(poVar2,"\"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&buildFileContents,"    outputs: [\"");
  poVar2 = std::operator<<(poVar2,(string *)&outputFilePath);
  poVar2 = std::operator<<(poVar2,"\", \"");
  poVar2 = std::operator<<(poVar2,(string *)&depInfoFilePath);
  poVar2 = std::operator<<(poVar2,"\"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&buildFileContents,"    deps: \"");
  poVar2 = std::operator<<(poVar2,(string *)&depInfoFilePath);
  poVar2 = std::operator<<(poVar2,"\"");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&buildFileContents,"  \"<all>\":");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&buildFileContents,"    tool: phony");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&buildFileContents,"    inputs: [\"");
  poVar2 = std::operator<<(poVar2,(string *)&outputFilePath);
  poVar2 = std::operator<<(poVar2,"\"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&buildFileContents,"    outputs: [\"<all>\"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string((string *)&local_330,(string *)&buildFilePath);
  std::__cxx11::stringbuf::str();
  writeFileContents(&local_330,&local_350);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_f0 = 0;
  uStack_e8 = 0;
  local_b8 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_108 = fs_get_file_contents;
  local_100 = 0;
  local_f8 = fs_get_file_info;
  local_e0 = lookup_tool;
  local_d8 = handle_diagnostic;
  local_d0 = had_command_failure;
  local_b0 = command_started;
  local_a8 = command_finished;
  local_a0 = command_found_discovered_dependency;
  local_68 = command_process_started;
  local_60 = command_process_had_error;
  local_58 = command_process_had_output;
  local_50 = command_process_finished;
  puVar5 = &local_118;
  puVar6 = (undefined8 *)&stack0xfffffffffffff9b8;
  for (lVar3 = 0x1d; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
  }
  system_p = llb_buildsystem_create
                       (in_stack_fffffffffffff9b8,
                        (llb_buildsystem_invocation_t)
                        ZEXT3448(CONCAT232(0x100,ZEXT832(buildFilePath._M_dataplus._M_p))));
  llb_buildsystem_initialize(system_p);
  key.length = 0;
  key.data = (uint8_t *)0x0;
  puts("initial build:");
  bVar1 = llb_buildsystem_build(system_p,&key);
  if (!bVar1) {
    puts("build had command failures");
  }
  std::__cxx11::string::string((string *)&local_370,(string *)&outputFilePath);
  readFileContents(&outputContentsFirstBuild,&local_370);
  std::__cxx11::string::_M_dispose();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
            ((internal *)&outputContentsSecondBuild,"outputContentsFirstBuild","\"1\"",
             &outputContentsFirstBuild,(char (*) [2])0x1ca2bc);
  if ((char)outputContentsSecondBuild._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (outputContentsSecondBuild._M_string_length == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)outputContentsSecondBuild._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_530,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/CAPI/BuildSystem-C-API.cpp"
               ,0x17f,pcVar7);
    testing::internal::AssertHelper::operator=(&local_530,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_530);
    if ((long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&outputContentsSecondBuild._M_string_length);
  llbuild::basic::sys::sleep(1);
  std::__cxx11::string::string((string *)&local_390,(string *)&indirectInputFilePath);
  std::__cxx11::string::string((string *)&local_3b0,"2",(allocator *)&outputContentsSecondBuild);
  writeFileContents(&local_390,&local_3b0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  puts("second build:");
  bVar1 = llb_buildsystem_build(system_p,&key);
  if (!bVar1) {
    puts("build had command failures");
  }
  std::__cxx11::string::string((string *)&local_3d0,(string *)&outputFilePath);
  readFileContents(&outputContentsSecondBuild,&local_3d0);
  std::__cxx11::string::_M_dispose();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
            ((internal *)&gtest_ar_1,"outputContentsSecondBuild","\"2\"",&outputContentsSecondBuild,
             (char (*) [2])0x1d630d);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_530);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/CAPI/BuildSystem-C-API.cpp"
               ,0x191,pcVar7);
    testing::internal::AssertHelper::operator=(&local_4b8,(Message *)&local_530);
    testing::internal::AssertHelper::~AssertHelper(&local_4b8);
    if (local_530.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_530.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  llb_buildsystem_destroy(system_p);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buildFileContents);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

TEST(BuildSystemCAPI, CustomToolWithDiscoveredDependencies) {
  std::string tmpDirPath = llbuild::basic::sys::makeTmpDir();
  for (auto& c : tmpDirPath) {
    if (c == '\\') {
      c = '/';
    }
  }
  // We write out an indirectly referenced file containing data to be copied to
  // the output file.
  std::string indirectInputFilePath = tmpDirPath + "/" + "indirect-input-file";
  writeFileContents(indirectInputFilePath, "1");
  
  // Write out a directly referenced file containing the path of the indirectly
  // referenced file.
  std::string directInputFilePath = tmpDirPath + "/" + "direct-input-file";
  writeFileContents(directInputFilePath, indirectInputFilePath);
  
  // The output file will be written by the tool.
  std::string outputFilePath = tmpDirPath + "/" + "output-file";
  
  // The dependency info file will also be written by the tool.
  std::string depInfoFilePath = tmpDirPath + "/" + "dep-info-file";
  
  // Write out a build manifest containing node definitions and a build rule to
  // use a custom rule to copy the contents of the indirect input file to the
  // output file, via the path in the direct input file.
  std::string buildFilePath = tmpDirPath + "/llbuild";  
  std::ostringstream buildFileContents;
  buildFileContents << "client:" << std::endl;
  buildFileContents << "  name: basic" << std::endl;
  buildFileContents << std::endl;
  buildFileContents << "targets:" << std::endl;
  buildFileContents << "  \"\": [\"<all>\"]" << std::endl;
  buildFileContents << std::endl;
  buildFileContents << "nodes:" << std::endl;
  buildFileContents << "  \"" << outputFilePath << "\": {}" << std::endl;
  buildFileContents << std::endl;
  buildFileContents << "commands:" << std::endl;
  buildFileContents << "  \"copy-indirectly|" << directInputFilePath << "|" << outputFilePath << "|" << depInfoFilePath << "\":" << std::endl;
  buildFileContents << "    tool: custom-depinfo-tester-tool" << std::endl;
  buildFileContents << "    inputs: [\"" << directInputFilePath << "\"]" << std::endl;
  buildFileContents << "    outputs: [\"" << outputFilePath << "\", \"" << depInfoFilePath << "\"]" << std::endl;
  buildFileContents << "    deps: \"" << depInfoFilePath << "\"" << std::endl;
  buildFileContents << "  \"<all>\":" << std::endl;
  buildFileContents << "    tool: phony" << std::endl;
  buildFileContents << "    inputs: [\"" << outputFilePath << "\"]" << std::endl;
  buildFileContents << "    outputs: [\"<all>\"]" << std::endl;
  writeFileContents(buildFilePath, buildFileContents.str());

  // Create an invocation.
  llb_buildsystem_invocation_t invocation = {};
  invocation.buildFilePath = buildFilePath.c_str();
  invocation.useSerialBuild = true;
  
  // Create a build system delegate.
  llb_buildsystem_delegate_t delegate = {};
  delegate.context = NULL;
  delegate.fs_get_file_contents = fs_get_file_contents;
  delegate.fs_get_file_info = fs_get_file_info;
  delegate.lookup_tool = lookup_tool;
  delegate.handle_diagnostic = handle_diagnostic;
  delegate.had_command_failure = had_command_failure;
  delegate.command_started = command_started;
  delegate.command_finished = command_finished;
  delegate.command_found_discovered_dependency = command_found_discovered_dependency;
  delegate.command_process_started = command_process_started;
  delegate.command_process_had_error = command_process_had_error;
  delegate.command_process_had_output = command_process_had_output;
  delegate.command_process_finished = command_process_finished;
  
  // Create a build system.
  llb_buildsystem_t* system = llb_buildsystem_create(delegate, invocation);
  
  // Initialize the system.
  llb_buildsystem_initialize(system);
  
  // Build the default target once.
  llb_data_t key = { 0, NULL };
  printf("initial build:\n");
  if (!llb_buildsystem_build(system, &key)) {
    printf("build had command failures\n");
  }
  
  // Check that the output file was produced and has the expected contents.
  std::string outputContentsFirstBuild = readFileContents(outputFilePath);
  EXPECT_EQ(outputContentsFirstBuild, "1");
  
  // Wait for at least a second because some filesystem only have file mod
  // times on the granularity of a second.
  // FIXME: might be better to just fake the timestamp on the file
  llbuild::basic::sys::sleep(1);

  // Change the contents of the indirect (not the direct) file.
  writeFileContents(indirectInputFilePath, "2");
  
  // Build the target again.
  printf("second build:\n");
  if (!llb_buildsystem_build(system, &key)) {
    printf("build had command failures\n");
  }
  
  // Check that the output file was updated and has the expected contents.
  std::string outputContentsSecondBuild = readFileContents(outputFilePath);
  EXPECT_EQ(outputContentsSecondBuild, "2");
  
  // Destroy the build system.
  llb_buildsystem_destroy(system);
}